

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O3

int cuddMinHammingDistRecur(DdNode *f,int *minterm,DdHashTable *table,int upperBound)

{
  int *piVar1;
  uint uVar2;
  DdManager *unique;
  int iVar3;
  int iVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *f_00;
  uint *puVar7;
  double value;
  
  if (upperBound == 0) {
    return 0;
  }
  unique = table->manager;
  puVar7 = (uint *)((ulong)f & 0xfffffffffffffffe);
  if (*puVar7 != 0x7fffffff) {
    pDVar5 = cuddHashTableLookup1(table,f);
    if (pDVar5 == (DdNode *)0x0) {
      pDVar6 = (DdNode *)((ulong)*(DdNode **)(puVar7 + 4) ^ 1);
      pDVar5 = (DdNode *)((ulong)*(DdNode **)(puVar7 + 6) ^ 1);
      if (((ulong)f & 1) == 0) {
        pDVar6 = *(DdNode **)(puVar7 + 4);
        pDVar5 = *(DdNode **)(puVar7 + 6);
      }
      iVar4 = minterm[*puVar7];
      f_00 = pDVar6;
      if (iVar4 == 0) {
        f_00 = pDVar5;
      }
      iVar3 = cuddMinHammingDistRecur(f_00,minterm,table,upperBound);
      if (iVar3 == -1) {
        return -1;
      }
      if (iVar3 != 0) {
        if (iVar4 == 0) {
          pDVar5 = pDVar6;
        }
        upperBound = cuddMinHammingDistRecur(pDVar5,minterm,table,upperBound + -1);
        if (upperBound == -1) {
          return -1;
        }
      }
      value = (double)upperBound + 1.0;
      if ((double)iVar3 <= (double)upperBound + 1.0) {
        value = (double)iVar3;
      }
      uVar2 = puVar7[1];
      if ((ulong)uVar2 != 1) {
        pDVar5 = cuddUniqueConst(unique,value);
        iVar4 = cuddHashTableInsert1(table,f,pDVar5,(ulong)uVar2 - 1);
        if (iVar4 == 0) {
          piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(unique,pDVar5);
          return -1;
        }
      }
    }
    else {
      value = (pDVar5->type).value;
      if (pDVar5->ref == 0) {
        unique->dead = unique->dead + 1;
        puVar7 = &(unique->constants).dead;
        *puVar7 = *puVar7 + 1;
      }
    }
    return (int)value;
  }
  if (unique->background == f) {
    return upperBound;
  }
  if ((DdNode *)((ulong)unique->one ^ 1) == f) {
    return upperBound;
  }
  return 0;
}

Assistant:

static int
cuddMinHammingDistRecur(
  DdNode * f,
  int *minterm,
  DdHashTable * table,
  int upperBound)
{
    DdNode      *F, *Ft, *Fe;
    double      h, hT, hE;
    DdNode      *zero, *res;
    DdManager   *dd = table->manager;

    statLine(dd);
    if (upperBound == 0) return(0);

    F = Cudd_Regular(f);

    if (cuddIsConstant(F)) {
        zero = Cudd_Not(DD_ONE(dd));
        if (f == dd->background || f == zero) {
            return(upperBound);
        } else {
            return(0);
        }
    }
    if ((res = cuddHashTableLookup1(table,f)) != NULL) {
        h = cuddV(res);
        if (res->ref == 0) {
            dd->dead++;
            dd->constants.dead++;
        }
        return((int) h);
    }

    Ft = cuddT(F); Fe = cuddE(F);
    if (Cudd_IsComplement(f)) {
        Ft = Cudd_Not(Ft); Fe = Cudd_Not(Fe);
    }
    if (minterm[F->index] == 0) {
        DdNode *temp = Ft;
        Ft = Fe; Fe = temp;
    }

    hT = cuddMinHammingDistRecur(Ft,minterm,table,upperBound);
    if (hT == CUDD_OUT_OF_MEM) return(CUDD_OUT_OF_MEM);
    if (hT == 0) {
        hE = upperBound;
    } else {
        hE = cuddMinHammingDistRecur(Fe,minterm,table,upperBound - 1);
        if (hE == CUDD_OUT_OF_MEM) return(CUDD_OUT_OF_MEM);
    }
    h = ddMin(hT, hE + 1);

    if (F->ref != 1) {
        ptrint fanout = (ptrint) F->ref;
        cuddSatDec(fanout);
        res = cuddUniqueConst(dd, (CUDD_VALUE_TYPE) h);
        if (!cuddHashTableInsert1(table,f,res,fanout)) {
            cuddRef(res); Cudd_RecursiveDeref(dd, res);
            return(CUDD_OUT_OF_MEM);
        }
    }

    return((int) h);

}